

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::h2(disp *this,string *s1,string *s2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_60,':',s1);
  std::operator+(&local_80,&local_60,':');
  std::operator+(&local_40,&local_80,s2);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void h2(std::string s1,std::string s2)
	{ v_ = ':'+s1+':'+s2; }